

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

int dict_real_word(dict_t *d,s3wid_t w)

{
  int iVar1;
  s3wid_t w_local;
  dict_t *d_local;
  
  if (d == (dict_t *)0x0) {
    __assert_fail("d",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                  ,0x1ab,"int dict_real_word(dict_t *, s3wid_t)");
  }
  if ((-1 < w) && (w < d->n_word)) {
    iVar1 = d->word[w].basewid;
    if ((iVar1 == d->startwid) || (iVar1 == d->finishwid)) {
      d_local._4_4_ = 0;
    }
    else if ((iVar1 < d->filler_start) || (d->filler_end < iVar1)) {
      d_local._4_4_ = 1;
    }
    else {
      d_local._4_4_ = 0;
    }
    return d_local._4_4_;
  }
  __assert_fail("(w >= 0) && (w < d->n_word)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                ,0x1ac,"int dict_real_word(dict_t *, s3wid_t)");
}

Assistant:

int
dict_real_word(dict_t *d, s3wid_t w)
{
    assert(d);
    assert((w >= 0) && (w < d->n_word));

    w = dict_basewid(d, w);
    if ((w == d->startwid) || (w == d->finishwid))
        return 0;
    if ((w >= d->filler_start) && (w <= d->filler_end))
        return 0;
    return 1;
}